

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O3

int __thiscall libtorrent::aux::piece_picker::num_peers(piece_picker *this,piece_block block)

{
  uint uVar1;
  int iVar2;
  download_queue_t queue;
  uint uVar3;
  iterator iVar4;
  int iVar5;
  
  uVar1 = *(uint *)((this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + block.piece_index.m_val.m_val);
  uVar3 = 0;
  if ((uVar1 & 0x1c000000) != 0x10000000) {
    queue.m_val = (byte)(uVar1 >> 0x1a) & 7;
    if (queue.m_val == 5) {
      queue.m_val = '\0';
    }
    else if ((uVar1 >> 0x1a & 7) == 6) {
      queue.m_val = '\x01';
    }
    iVar4 = find_dl_piece(this,queue,block.piece_index.m_val);
    iVar2 = this->m_piece_size;
    iVar5 = 0x4000;
    if (iVar2 < 0x4000) {
      iVar5 = iVar2;
    }
    uVar3 = *(ushort *)
             &(this->m_block_info).
              super_vector<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
              .
              super__Vector_base<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(long)((iVar2 + iVar5 + -1) / iVar5) * (ulong)(iVar4._M_current)->info_idx +
               ((long)block >> 0x20)].field_0x8 & 0x3fff;
  }
  return uVar3;
}

Assistant:

int piece_picker::num_peers(piece_block const block) const
	{
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());
		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));

		piece_pos const& p = m_piece_map[block.piece_index];
		if (!p.downloading()) return 0;

		auto const i = find_dl_piece(p.download_queue(), block.piece_index);
		TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());

		auto const binfo = blocks_for_piece(*i);
		block_info const& info = binfo[block.block_index];
		TORRENT_ASSERT(&info >= &m_block_info[0]);
		TORRENT_ASSERT(&info < &m_block_info[0] + m_block_info.size());
		TORRENT_ASSERT(info.piece_index == block.piece_index);
		return info.num_peers;
	}